

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

void mxx::scatter<std::pair<int,double>>
               (pair<int,_double> *msgs,size_t size,pair<int,_double> *out,int root,comm *comm)

{
  datatype dt;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::scatter_big<std::pair<int,double>>(msgs,size,out,root,comm);
    return;
  }
  dt.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
  dt._vptr_datatype = (_func_int **)&PTR__datatype_0017fc80;
  dt.builtin = false;
  MPI_Scatter(msgs,size & 0xffffffff,dt.mpitype,out,size & 0xffffffff,dt.mpitype,root,comm->mpi_comm
             );
  datatype::~datatype(&dt);
  return;
}

Assistant:

void scatter(const T* msgs, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm())
{
    if (size*comm.size() >= mxx::max_int) {
        // own scatter for large messages
        impl::scatter_big(msgs, size, out, root, comm);
    } else {
        // regular implementation
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Scatter(const_cast<T*>(msgs), size, dt.type(),
                    out, size, dt.type(), root, comm);
    }
}